

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

mg_connection *
mg_download(char *host,int port,int use_ssl,char *ebuf,size_t ebuf_len,char *fmt,...)

{
  char in_AL;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [48];
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  int local_60;
  int local_5c;
  int reqerr;
  int i;
  va_list ap;
  mg_connection *local_38;
  mg_connection *conn;
  char *fmt_local;
  size_t ebuf_len_local;
  char *ebuf_local;
  int use_ssl_local;
  int port_local;
  char *host_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  if (ebuf_len != 0) {
    *ebuf = '\0';
  }
  ap[0].overflow_arg_area = local_118;
  ap[0]._0_8_ = &stack0x00000008;
  i = 0x30;
  reqerr = 0x30;
  local_38 = mg_connect_client(host,port,use_ssl,ebuf,ebuf_len);
  if (local_38 != (mg_connection *)0x0) {
    local_5c = mg_vprintf(local_38,fmt,(__va_list_tag *)&reqerr);
    if (local_5c < 1) {
      mg_snprintf(local_38,(int *)0x0,ebuf,ebuf_len,"%s","Error sending request");
    }
    else {
      local_38->data_len = 0;
      get_response(local_38,ebuf,ebuf_len,&local_60);
      (local_38->request_info).local_uri = (local_38->request_info).request_uri;
    }
  }
  if ((*ebuf != '\0') && (local_38 != (mg_connection *)0x0)) {
    mg_close_connection(local_38);
    local_38 = (mg_connection *)0x0;
  }
  return local_38;
}

Assistant:

mg_connection *
mg_download(const char *host,
            int port,
            int use_ssl,
            char *ebuf,
            size_t ebuf_len,
            const char *fmt,
            ...)
{
	struct mg_connection *conn;
	va_list ap;
	int i;
	int reqerr;

	if (ebuf_len > 0) {
		ebuf[0] = '\0';
	}

	va_start(ap, fmt);

	/* open a connection */
	conn = mg_connect_client(host, port, use_ssl, ebuf, ebuf_len);

	if (conn != NULL) {
		i = mg_vprintf(conn, fmt, ap);
		if (i <= 0) {
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "Error sending request");
		} else {
			/* make sure the buffer is clear */
			conn->data_len = 0;
			get_response(conn, ebuf, ebuf_len, &reqerr);

			/* TODO: here, the URI is the http response code */
			conn->request_info.local_uri = conn->request_info.request_uri;
		}
	}

	/* if an error occurred, close the connection */
	if ((ebuf[0] != '\0') && (conn != NULL)) {
		mg_close_connection(conn);
		conn = NULL;
	}

	va_end(ap);
	return conn;
}